

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O0

ssize_t __thiscall sisl::utility::ply_mesh::write(ply_mesh *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  CoeffReturnType pdVar7;
  ulong uVar8;
  const_reference pvVar9;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var10;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var11;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var12;
  undefined8 uVar13;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *this_00;
  undefined1 local_25d;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> local_25c;
  undefined1 auStack_258 [3];
  _f f;
  uint i_1;
  _p p;
  uint i;
  ostream local_220 [8];
  ofstream fp;
  string *out_local;
  ply_mesh *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_220,pcVar3,_Var2);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    poVar4 = std::operator<<(local_220,"ply");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"format binary_little_endian 1.0");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"element vertex ");
    sVar5 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::size(&this->verts);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property float x");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property float y");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property float z");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property float nx");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property float ny");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property float nz");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"element face ");
    sVar5 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
            size(&this->faces);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"property list uchar int vertex_indices");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_220,"end_header");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    p.j = 0.0;
    while( true ) {
      sVar5 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::size(&this->verts);
      if (sVar5 <= (uint)p.j) break;
      pvVar6 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::operator[]
                         (&this->verts,(ulong)(uint)p.j);
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pvVar6,0);
      f.k = (int)(float)*pdVar7;
      pvVar6 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::operator[]
                         (&this->verts,(ulong)(uint)p.j);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pvVar6,1);
      pvVar6 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::operator[]
                         (&this->verts,(ulong)(uint)p.j);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)pvVar6,2);
      pvVar6 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::operator[]
                         (&this->verts,(ulong)(uint)p.j);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&pvVar6->n,0);
      pvVar6 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::operator[]
                         (&this->verts,(ulong)(uint)p.j);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&pvVar6->n,1);
      pvVar6 = std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::operator[]
                         (&this->verts,(ulong)(uint)p.j);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&pvVar6->n,2);
      std::ostream::write((char *)local_220,(long)&f.k);
      p.j = (float)((int)p.j + 1);
    }
    f.j = 0;
    while( true ) {
      uVar8 = (ulong)(uint)f.j;
      sVar5 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
              size(&this->faces);
      if (sVar5 <= uVar8) break;
      local_25d = 3;
      this_00 = &this->faces;
      pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
               operator[](this_00,(ulong)(uint)f.j);
      p_Var10 = std::get<0ul,int,int,int>(pvVar9);
      local_25c = *p_Var10;
      pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
               operator[](this_00,(ulong)(uint)f.j);
      p_Var11 = std::get<1ul,int,int,int>(pvVar9);
      _auStack_258 = *p_Var11;
      pvVar9 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
               operator[](this_00,(ulong)(uint)f.j);
      p_Var12 = std::get<2ul,int,int,int>(pvVar9);
      f.i = *p_Var12;
      std::ostream::write((char *)local_220,(long)&local_25d);
      f.j = f.j + 1;
    }
    std::ofstream::close();
    this_local._7_1_ = 1;
  }
  uVar13 = std::ofstream::~ofstream(local_220);
  return CONCAT71((int7)((ulong)uVar13 >> 8),this_local._7_1_);
}

Assistant:

bool write(const std::string &out) const {
            using namespace std;

            ofstream fp(out.c_str(), ios::out | ios::binary);
            if(!fp.good()) return false;

            // We're going to output in binary, but all PLY
            // files have an ascii header
            fp << "ply" << endl;
            fp << "format binary_little_endian 1.0" << endl;
            fp << "element vertex " << verts.size() << endl;
            fp << "property float x" << endl;
            fp << "property float y" << endl;
            fp << "property float z" << endl;
            fp << "property float nx" << endl;
            fp << "property float ny" << endl;
            fp << "property float nz" << endl;
            fp << "element face " << faces.size() << endl;
            fp << "property list uchar int vertex_indices" << endl;
            fp << "end_header" << endl;

            for(unsigned int i = 0; i < verts.size(); i++) {
                struct _p {
                    float x, y, z, i, j , k;
                }__attribute__ ((packed)) p;

                p.x = verts[i].p[0];
                p.y = verts[i].p[1];
                p.z = verts[i].p[2];
                p.i = verts[i].n[0];
                p.j = verts[i].n[1];
                p.k = verts[i].n[2];
                fp.write((char*)&p, sizeof(_p));
            }

            for(unsigned int i = 0; i < faces.size(); i++) {
                struct _f {
                    char t;
                    int i,j,k;
                } __attribute__ ((packed)) f;

                f.t = 3;
                f.i = std::get<0>(faces[i]);
                f.j = std::get<1>(faces[i]);
                f.k = std::get<2>(faces[i]);
                fp.write((char*)&f, sizeof(_f));
            }
            fp.close();
            return true;
        }